

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86.cpp
# Opt level: O1

int __thiscall
ncnn::Deconvolution_x86::forward(Deconvolution_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  undefined4 uVar12;
  int iVar13;
  uint uVar14;
  _func_int *p_Var15;
  int *piVar16;
  void *pvVar17;
  size_t sVar18;
  size_t sVar19;
  size_t sVar20;
  size_t sVar21;
  _func_int **pp_Var22;
  _func_int **pp_Var23;
  _func_int **pp_Var24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined4 uVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  Mat *pMVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  _func_int *p_Var47;
  long lVar48;
  long lVar49;
  int iVar50;
  int iVar51;
  int iVar52;
  ulong uVar53;
  undefined1 (*pauVar54) [16];
  ulong uVar55;
  int y_1;
  uint uVar56;
  ulong uVar57;
  uint uVar58;
  ulong uVar59;
  void *pvVar60;
  long lVar61;
  long lVar62;
  ulong uVar63;
  int y_2;
  ulong uVar64;
  void *pvVar65;
  undefined1 extraout_var [12];
  undefined1 auVar66 [16];
  float fVar67;
  float fVar68;
  v4sf one;
  float fVar69;
  float fVar70;
  float fVar82;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar83 [12];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  int h_1;
  int outw;
  int outh_1;
  int outh;
  int h;
  ulong local_1b0;
  uint local_194;
  long local_190;
  _func_int **local_188;
  _func_int **local_160;
  ulong local_150;
  Mat local_f8;
  ulong local_a8;
  int local_9c;
  undefined1 local_98 [16];
  _func_int **local_80;
  undefined1 local_78 [16];
  Mat *local_60;
  ulong local_58;
  _func_int *local_50;
  Option *local_48;
  long local_40;
  long local_38;
  
  iVar7 = bottom_blob->w;
  iVar8 = bottom_blob->h;
  uVar57 = bottom_blob->elemsize;
  local_a8 = (ulong)bottom_blob->elempack;
  p_Var47 = this->_vptr_Deconvolution_x86[-3];
  local_194 = 1;
  if (opt->use_packing_layout == true) {
    local_194 = (uint)(((&this->field_0xd0)[(long)p_Var47] & 3) == 0) * 3 + 1;
  }
  iVar52 = *(int *)(&this->field_0xd4 + (long)p_Var47);
  local_9c = *(int *)(&this->field_0xdc + (long)p_Var47);
  iVar9 = *(int *)(&this->field_0xe4 + (long)p_Var47);
  iVar50 = (*(int *)(&this->field_0xd8 + (long)p_Var47) + -1) *
           *(int *)(&this->field_0xe0 + (long)p_Var47);
  iVar51 = *(int *)(&this->field_0xe8 + (long)p_Var47);
  iVar46 = *(int *)(&this->field_0xfc + (long)p_Var47);
  iVar42 = *(int *)(&this->field_0x100 + (long)p_Var47);
  local_f8.cstep = 0;
  local_f8.data = (_func_int **)0x0;
  local_f8.refcount._0_4_ = 0;
  local_f8.refcount._4_4_ = 0;
  local_f8.elemsize._0_4_ = 0;
  local_f8.elemsize._4_4_ = 0;
  local_f8.elempack = 0;
  local_f8.allocator = (Allocator *)0x0;
  local_f8.dims = 0;
  local_f8.w = 0;
  local_f8.h = 0;
  local_f8.d = 0;
  local_f8.c = 0;
  p_Var15 = this->_vptr_Deconvolution_x86[-3];
  p_Var47 = (_func_int *)((long)&this->_vptr_Deconvolution_x86 + (long)p_Var15);
  lVar61 = 0x10;
  if (((((*(int *)(&this->field_0xec + (long)p_Var15) < 1) && (*(int *)(p_Var47 + 0xf0) < 1)) &&
       (*(int *)(p_Var47 + 0xf4) < 1)) && (*(int *)(p_Var47 + 0xf8) < 1)) &&
     ((*(int *)(p_Var47 + 0x104) < 1 || (*(int *)(p_Var47 + 0x108) < 1)))) {
    if (&local_f8 != top_blob) {
      piVar16 = top_blob->refcount;
      if (piVar16 != (int *)0x0) {
        LOCK();
        *piVar16 = *piVar16 + 1;
        UNLOCK();
      }
      local_f8.data = top_blob->data;
      local_f8.refcount._0_4_ = SUB84(top_blob->refcount,0);
      local_f8.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
      local_f8.elemsize._0_4_ = (undefined4)top_blob->elemsize;
      local_f8.elemsize._4_4_ = (undefined4)(top_blob->elemsize >> 0x20);
      local_f8.elempack = top_blob->elempack;
      local_f8.allocator = top_blob->allocator;
      uVar34 = top_blob->dims;
      uVar35 = top_blob->w;
      uVar36 = top_blob->h;
      uVar37 = top_blob->d;
      local_f8.c = top_blob->c;
      local_f8.cstep = top_blob->cstep;
      local_f8.dims = uVar34;
      local_f8.w = uVar35;
      local_f8.h = uVar36;
      local_f8.d = uVar37;
    }
    p_Var47 = (_func_int *)
              ((long)&this->_vptr_Deconvolution_x86 + (long)this->_vptr_Deconvolution_x86[-3]);
    lVar61 = 8;
  }
  local_9c = (iVar52 + -1) * local_9c;
  local_60 = top_blob;
  local_48 = opt;
  Mat::create(&local_f8,iVar46 + (iVar7 + -1) * iVar9 + local_9c + 1,
              iVar42 + (iVar8 + -1) * iVar51 + iVar50 + 1,*(int *)(p_Var47 + 0xd0) / (int)local_194,
              (uVar57 / local_a8) * (ulong)local_194,local_194,
              *(Allocator **)(&opt->lightmode + lVar61));
  iVar8 = local_f8.h;
  iVar7 = local_f8.w;
  auVar86 = _DAT_0054dea0;
  auVar32 = _DAT_0054de70;
  auVar84 = _DAT_0054de60;
  iVar52 = -100;
  if (((_func_int **)local_f8.data != (_func_int **)0x0) && ((long)local_f8.c * local_f8.cstep != 0)
     ) {
    local_80 = this->_vptr_Deconvolution_x86;
    p_Var47 = local_80[-3];
    uVar10 = *(uint *)(&this->field_0xd4 + (long)p_Var47);
    uVar11 = *(uint *)(&this->field_0xd8 + (long)p_Var47);
    local_78._0_8_ = CONCAT44(0,uVar11);
    if (((int)local_a8 == 4) && ((local_194 == 4 && (0 < (long)local_f8.c)))) {
      iVar52 = *(int *)(&this->field_0xdc + (long)p_Var47);
      iVar9 = *(int *)(&this->field_0xe0 + (long)p_Var47);
      iVar51 = *(int *)(&this->field_0xe4 + (long)p_Var47);
      iVar46 = *(int *)(&this->field_0xe8 + (long)p_Var47);
      uVar12 = *(undefined4 *)(&this->field_0x114 + (long)p_Var47);
      lVar61 = *(long *)(&this->field_0x1a8 + (long)p_Var47);
      lVar48 = (long)(int)(uVar10 * uVar11 * 0x10);
      local_98._0_8_ = lVar48;
      local_190 = 0;
      fVar67 = (float)DAT_0054dea0;
      auVar85._0_4_ = DAT_0054dea0._4_4_;
      fVar68 = DAT_0054dea0._8_4_;
      fVar69 = DAT_0054dea0._12_4_;
      do {
        if (0 < local_f8.h) {
          iVar42 = bottom_blob->w;
          iVar13 = bottom_blob->h;
          pauVar54 = (undefined1 (*) [16])
                     (local_f8.cstep * local_190 *
                      CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize) +
                     (long)local_f8.data);
          uVar14 = bottom_blob->c;
          iVar41 = 0;
          do {
            if (0 < local_f8.w) {
              uVar58 = 0;
              iVar45 = (1 - uVar10) * iVar52;
              do {
                auVar76 = ZEXT816(0);
                if (lVar61 == 0) {
                  auVar101 = ZEXT816(0);
                }
                else {
                  auVar101 = *(undefined1 (*) [16])(lVar61 + local_190 * 0x10);
                }
                if (0 < (int)uVar14) {
                  pvVar65 = (void *)((this->weight_data_tm).cstep * local_190 *
                                     (this->weight_data_tm).elemsize +
                                    (long)(this->weight_data_tm).data);
                  pvVar17 = bottom_blob->data;
                  uVar57 = 0;
                  do {
                    if (0 < (int)uVar11) {
                      uVar55 = 0;
                      uVar59 = 0;
                      do {
                        iVar39 = (((int)uVar59 - uVar11) + 1) * iVar9 + iVar41;
                        if ((((-1 < iVar39) && (iVar40 = iVar39 / iVar46, iVar39 % iVar46 == 0)) &&
                            (0 < (int)uVar10)) && (iVar40 < iVar13)) {
                          lVar62 = (long)iVar40 * (long)bottom_blob->w * bottom_blob->elemsize +
                                   bottom_blob->cstep * bottom_blob->elemsize * uVar57;
                          uVar63 = (ulong)uVar10;
                          uVar64 = uVar55;
                          iVar39 = iVar45;
                          do {
                            if (((-1 < iVar39) && (iVar40 = iVar39 / iVar51, iVar39 % iVar51 == 0))
                               && (iVar40 < iVar42)) {
                              lVar49 = (long)(iVar40 << 2);
                              fVar70 = *(float *)((long)pvVar17 + lVar49 * 4 + lVar62);
                              fVar91 = *(float *)((long)pvVar17 + lVar49 * 4 + lVar62 + 4);
                              uVar53 = uVar64 & 0xffffffff;
                              pfVar1 = (float *)((long)pvVar65 + uVar53 * 4);
                              fVar82 = *(float *)((long)pvVar17 + lVar49 * 4 + lVar62 + 8);
                              fVar96 = auVar101._4_4_;
                              fVar97 = auVar101._8_4_;
                              fVar98 = auVar101._12_4_;
                              fVar93 = *(float *)((long)pvVar17 + lVar49 * 4 + lVar62 + 0xc);
                              pfVar2 = (float *)((long)pvVar65 + uVar53 * 4 + 0x10);
                              pfVar3 = (float *)((long)pvVar65 + uVar53 * 4 + 0x20);
                              pfVar4 = (float *)((long)pvVar65 + uVar53 * 4 + 0x30);
                              auVar101._0_4_ =
                                   fVar93 * *pfVar4 +
                                   fVar82 * *pfVar3 + fVar91 * *pfVar2 +
                                   fVar70 * *pfVar1 + auVar101._0_4_;
                              auVar101._4_4_ =
                                   fVar93 * pfVar4[1] +
                                   fVar82 * pfVar3[1] + fVar91 * pfVar2[1] +
                                   fVar70 * pfVar1[1] + fVar96;
                              auVar101._8_4_ =
                                   fVar93 * pfVar4[2] +
                                   fVar82 * pfVar3[2] + fVar91 * pfVar2[2] +
                                   fVar70 * pfVar1[2] + fVar97;
                              auVar101._12_4_ =
                                   fVar93 * pfVar4[3] +
                                   fVar82 * pfVar3[3] + fVar91 * pfVar2[3] +
                                   fVar70 * pfVar1[3] + fVar98;
                            }
                            uVar64 = uVar64 + 0x10;
                            iVar39 = iVar39 + iVar52;
                            uVar63 = uVar63 - 1;
                          } while (uVar63 != 0);
                        }
                        uVar59 = uVar59 + 1;
                        uVar55 = uVar55 + (ulong)uVar10 * 0x10;
                      } while (uVar59 != CONCAT44(0,uVar11));
                    }
                    pvVar65 = (void *)((long)pvVar65 + lVar48 * 4);
                    uVar57 = uVar57 + 1;
                  } while (uVar57 != uVar14);
                }
                fVar70 = auVar101._0_4_;
                fVar91 = auVar101._4_4_;
                fVar82 = auVar101._8_4_;
                fVar93 = auVar101._12_4_;
                switch(uVar12) {
                case 1:
                  auVar101 = maxps(auVar101,auVar76);
                  break;
                case 2:
                  auVar75 = maxps(auVar101,auVar76);
                  auVar76 = minps(auVar101,auVar76);
                  fVar70 = **(float **)(&this->field_0x118 + (long)p_Var47);
                  auVar101._4_4_ = fVar70 * auVar76._4_4_ + auVar75._4_4_;
                  auVar101._0_4_ = fVar70 * auVar76._0_4_ + auVar75._0_4_;
                  auVar101._8_4_ = fVar70 * auVar76._8_4_ + auVar75._8_4_;
                  auVar101._12_4_ = fVar70 * auVar76._12_4_ + auVar75._12_4_;
                  break;
                case 3:
                  uVar5 = **(undefined4 **)(&this->field_0x118 + (long)p_Var47);
                  uVar6 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var47))[1];
                  auVar73._4_4_ = uVar5;
                  auVar73._0_4_ = uVar5;
                  auVar73._8_4_ = uVar5;
                  auVar73._12_4_ = uVar5;
                  auVar76 = maxps(auVar101,auVar73);
                  auVar27._4_4_ = uVar6;
                  auVar27._0_4_ = uVar6;
                  auVar27._8_4_ = uVar6;
                  auVar27._12_4_ = uVar6;
                  auVar101 = minps(auVar76,auVar27);
                  break;
                case 4:
                  auVar87._0_8_ = auVar101._0_8_ ^ 0x8000000080000000;
                  auVar87._8_4_ = -fVar82;
                  auVar87._12_4_ = -fVar93;
                  auVar76 = minps(auVar87,auVar84);
                  auVar76 = maxps(auVar76,auVar32);
                  fVar91 = auVar76._0_4_ * 1.442695 + 0.5;
                  fVar93 = auVar76._4_4_ * 1.442695 + 0.5;
                  fVar97 = auVar76._8_4_ * 1.442695 + 0.5;
                  fVar99 = auVar76._12_4_ * 1.442695 + 0.5;
                  fVar70 = (float)(int)fVar91;
                  fVar82 = (float)(int)fVar93;
                  fVar96 = (float)(int)fVar97;
                  fVar98 = (float)(int)fVar99;
                  fVar70 = fVar70 - (float)(-(uint)(fVar91 < fVar70) & (uint)fVar67);
                  fVar82 = fVar82 - (float)(-(uint)(fVar93 < fVar82) & (uint)auVar85._0_4_);
                  fVar96 = fVar96 - (float)(-(uint)(fVar97 < fVar96) & (uint)fVar68);
                  fVar98 = fVar98 - (float)(-(uint)(fVar99 < fVar98) & (uint)fVar69);
                  fVar91 = fVar70 * -0.6931472 + auVar76._0_4_;
                  fVar93 = fVar82 * -0.6931472 + auVar76._4_4_;
                  fVar97 = fVar96 * -0.6931472 + auVar76._8_4_;
                  fVar99 = fVar98 * -0.6931472 + auVar76._12_4_;
                  auVar74._0_4_ =
                       fVar91 + fVar67 +
                       (((((fVar91 * 0.00019875691 + 0.0013981999) * fVar91 + 0.008333452) * fVar91
                         + 0.041665796) * fVar91 + 0.16666666) * fVar91 + 0.5) * fVar91 * fVar91;
                  auVar74._4_4_ =
                       fVar93 + auVar85._0_4_ +
                       (((((fVar93 * 0.00019875691 + 0.0013981999) * fVar93 + 0.008333452) * fVar93
                         + 0.041665796) * fVar93 + 0.16666666) * fVar93 + 0.5) * fVar93 * fVar93;
                  auVar74._8_4_ =
                       fVar97 + fVar68 +
                       (((((fVar97 * 0.00019875691 + 0.0013981999) * fVar97 + 0.008333452) * fVar97
                         + 0.041665796) * fVar97 + 0.16666666) * fVar97 + 0.5) * fVar97 * fVar97;
                  auVar74._12_4_ =
                       fVar99 + fVar69 +
                       (((((fVar99 * 0.00019875691 + 0.0013981999) * fVar99 + 0.008333452) * fVar99
                         + 0.041665796) * fVar99 + 0.16666666) * fVar99 + 0.5) * fVar99 * fVar99;
                  fVar97 = (float)((int)fVar70 * 0x800000 + (int)fVar67) * auVar74._0_4_ + fVar67;
                  fVar99 = (float)((int)fVar82 * 0x800000 + (int)auVar85._0_4_) * auVar74._4_4_ +
                           auVar85._0_4_;
                  fVar96 = (float)((int)fVar96 * 0x800000 + (int)fVar68) * auVar74._8_4_ + fVar68;
                  fVar98 = (float)((int)fVar98 * 0x800000 + (int)fVar69) * auVar74._12_4_ + fVar69;
                  auVar26._4_4_ = fVar99;
                  auVar26._0_4_ = fVar97;
                  auVar26._8_4_ = fVar96;
                  auVar26._12_4_ = fVar98;
                  auVar76 = rcpps(auVar74,auVar26);
                  fVar70 = auVar76._0_4_;
                  fVar91 = auVar76._4_4_;
                  fVar82 = auVar76._8_4_;
                  fVar93 = auVar76._12_4_;
                  auVar101._0_4_ = (fVar67 - fVar97 * fVar70) * fVar70 + fVar70;
                  auVar101._4_4_ = (auVar85._0_4_ - fVar99 * fVar91) * fVar91 + fVar91;
                  auVar101._8_4_ = (fVar68 - fVar96 * fVar82) * fVar82 + fVar82;
                  auVar101._12_4_ = (fVar69 - fVar98 * fVar93) * fVar93 + fVar93;
                  break;
                case 5:
                  auVar76 = minps(auVar101,auVar84);
                  auVar76 = maxps(auVar76,auVar32);
                  fVar96 = auVar76._0_4_ * 1.442695 + 0.5;
                  fVar97 = auVar76._4_4_ * 1.442695 + 0.5;
                  fVar98 = auVar76._8_4_ * 1.442695 + 0.5;
                  fVar99 = auVar76._12_4_ * 1.442695 + 0.5;
                  fVar90 = (float)(int)fVar96;
                  fVar92 = (float)(int)fVar97;
                  fVar94 = (float)(int)fVar98;
                  fVar95 = (float)(int)fVar99;
                  fVar90 = fVar90 - (float)(-(uint)(fVar96 < fVar90) & (uint)fVar67);
                  fVar92 = fVar92 - (float)(-(uint)(fVar97 < fVar92) & (uint)auVar85._0_4_);
                  fVar94 = fVar94 - (float)(-(uint)(fVar98 < fVar94) & (uint)fVar68);
                  fVar95 = fVar95 - (float)(-(uint)(fVar99 < fVar95) & (uint)fVar69);
                  fVar96 = auVar76._0_4_ - fVar90 * 0.6931472;
                  fVar97 = auVar76._4_4_ - fVar92 * 0.6931472;
                  fVar98 = auVar76._8_4_ - fVar94 * 0.6931472;
                  fVar99 = auVar76._12_4_ - fVar95 * 0.6931472;
                  auVar100._0_4_ =
                       (float)((int)fVar90 * 0x800000 + (int)fVar67) *
                       (fVar96 + fVar67 +
                       (((((fVar96 * 0.00019875691 + 0.0013981999) * fVar96 + 0.008333452) * fVar96
                         + 0.041665796) * fVar96 + 0.16666666) * fVar96 + 0.5) * fVar96 * fVar96) +
                       fVar67;
                  auVar100._4_4_ =
                       (float)((int)fVar92 * 0x800000 + (int)auVar85._0_4_) *
                       (fVar97 + auVar85._0_4_ +
                       (((((fVar97 * 0.00019875691 + 0.0013981999) * fVar97 + 0.008333452) * fVar97
                         + 0.041665796) * fVar97 + 0.16666666) * fVar97 + 0.5) * fVar97 * fVar97) +
                       auVar85._0_4_;
                  auVar100._8_4_ =
                       (float)((int)fVar94 * 0x800000 + (int)fVar68) *
                       (fVar98 + fVar68 +
                       (((((fVar98 * 0.00019875691 + 0.0013981999) * fVar98 + 0.008333452) * fVar98
                         + 0.041665796) * fVar98 + 0.16666666) * fVar98 + 0.5) * fVar98 * fVar98) +
                       fVar68;
                  auVar100._12_4_ =
                       (float)((int)fVar95 * 0x800000 + (int)fVar69) *
                       (fVar99 + fVar69 +
                       (((((fVar99 * 0.00019875691 + 0.0013981999) * fVar99 + 0.008333452) * fVar99
                         + 0.041665796) * fVar99 + 0.16666666) * fVar99 + 0.5) * fVar99 * fVar99) +
                       fVar69;
                  auVar101 = maxps(auVar100,_DAT_0054df10);
                  fVar96 = (float)(auVar101._0_4_ & 0x807fffff | 0x3f000000);
                  fVar98 = (float)(auVar101._4_4_ & 0x807fffff | 0x3f000000);
                  fVar90 = (float)(auVar101._8_4_ & 0x807fffff | 0x3f000000);
                  fVar94 = (float)(auVar101._12_4_ & 0x807fffff | 0x3f000000);
                  fVar97 = fVar96 + -1.0 + (float)(-(uint)(fVar96 < 0.70710677) & (uint)fVar96);
                  fVar99 = fVar98 + -1.0 + (float)(-(uint)(fVar98 < 0.70710677) & (uint)fVar98);
                  fVar92 = fVar90 + -1.0 + (float)(-(uint)(fVar90 < 0.70710677) & (uint)fVar90);
                  fVar95 = fVar94 + -1.0 + (float)(-(uint)(fVar94 < 0.70710677) & (uint)fVar94);
                  auVar71._0_8_ =
                       CONCAT44(-(uint)(auVar100._4_4_ <= 0.0),-(uint)(auVar100._0_4_ <= 0.0)) &
                       0x7fffffff7fffffff;
                  auVar71._8_4_ = -(uint)(auVar100._8_4_ <= 0.0) & 0x7fffffff;
                  auVar71._12_4_ = -(uint)(auVar100._12_4_ <= 0.0) & 0x7fffffff;
                  auVar76._4_4_ =
                       ~-(uint)(auVar100._4_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar101._4_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar98 < 0.70710677) & (uint)auVar85._0_4_)) *
                               0.6931472 + fVar99 +
                              (((((((((fVar99 * 0.070376836 + -0.1151461) * fVar99 + 0.116769984) *
                                     fVar99 + -0.12420141) * fVar99 + 0.14249323) * fVar99 +
                                  -0.16668057) * fVar99 + 0.20000714) * fVar99 + -0.24999994) *
                                fVar99 + 0.3333333) * fVar99 + -0.5) * fVar99 * fVar99) * -2.0);
                  auVar76._0_4_ =
                       ~-(uint)(auVar100._0_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar101._0_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar96 < 0.70710677) & (uint)fVar67)) * 0.6931472 +
                               fVar97 + (((((((((fVar97 * 0.070376836 + -0.1151461) * fVar97 +
                                               0.116769984) * fVar97 + -0.12420141) * fVar97 +
                                             0.14249323) * fVar97 + -0.16668057) * fVar97 +
                                           0.20000714) * fVar97 + -0.24999994) * fVar97 + 0.3333333)
                                         * fVar97 + -0.5) * fVar97 * fVar97) * -2.0);
                  auVar76._8_4_ =
                       ~-(uint)(auVar100._8_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar101._8_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar90 < 0.70710677) & (uint)fVar68)) * 0.6931472 +
                               fVar92 + (((((((((fVar92 * 0.070376836 + -0.1151461) * fVar92 +
                                               0.116769984) * fVar92 + -0.12420141) * fVar92 +
                                             0.14249323) * fVar92 + -0.16668057) * fVar92 +
                                           0.20000714) * fVar92 + -0.24999994) * fVar92 + 0.3333333)
                                         * fVar92 + -0.5) * fVar92 * fVar92) * -2.0);
                  auVar76._12_4_ =
                       ~-(uint)(auVar100._12_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar101._12_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar94 < 0.70710677) & (uint)fVar69)) * 0.6931472 +
                               fVar95 + (((((((((fVar95 * 0.070376836 + -0.1151461) * fVar95 +
                                               0.116769984) * fVar95 + -0.12420141) * fVar95 +
                                             0.14249323) * fVar95 + -0.16668057) * fVar95 +
                                           0.20000714) * fVar95 + -0.24999994) * fVar95 + 0.3333333)
                                         * fVar95 + -0.5) * fVar95 * fVar95) * -2.0);
                  auVar76 = minps(auVar71 | auVar76,auVar84);
                  auVar76 = maxps(auVar76,auVar32);
                  fVar96 = auVar76._0_4_ * 1.442695 + 0.5;
                  fVar97 = auVar76._4_4_ * 1.442695 + 0.5;
                  fVar98 = auVar76._8_4_ * 1.442695 + 0.5;
                  fVar99 = auVar76._12_4_ * 1.442695 + 0.5;
                  fVar90 = (float)(int)fVar96;
                  fVar92 = (float)(int)fVar97;
                  fVar94 = (float)(int)fVar98;
                  fVar95 = (float)(int)fVar99;
                  fVar90 = fVar90 - (float)(-(uint)(fVar96 < fVar90) & (uint)fVar67);
                  fVar92 = fVar92 - (float)(-(uint)(fVar97 < fVar92) & (uint)auVar85._0_4_);
                  fVar94 = fVar94 - (float)(-(uint)(fVar98 < fVar94) & (uint)fVar68);
                  fVar95 = fVar95 - (float)(-(uint)(fVar99 < fVar95) & (uint)fVar69);
                  fVar96 = auVar76._0_4_ - fVar90 * 0.6931472;
                  fVar97 = auVar76._4_4_ - fVar92 * 0.6931472;
                  fVar98 = auVar76._8_4_ - fVar94 * 0.6931472;
                  fVar99 = auVar76._12_4_ - fVar95 * 0.6931472;
                  auVar72._0_4_ =
                       fVar96 + fVar67 +
                       (((((fVar96 * 0.00019875691 + 0.0013981999) * fVar96 + 0.008333452) * fVar96
                         + 0.041665796) * fVar96 + 0.16666666) * fVar96 + 0.5) * fVar96 * fVar96;
                  auVar72._4_4_ =
                       fVar97 + auVar85._0_4_ +
                       (((((fVar97 * 0.00019875691 + 0.0013981999) * fVar97 + 0.008333452) * fVar97
                         + 0.041665796) * fVar97 + 0.16666666) * fVar97 + 0.5) * fVar97 * fVar97;
                  auVar72._8_4_ =
                       fVar98 + fVar68 +
                       (((((fVar98 * 0.00019875691 + 0.0013981999) * fVar98 + 0.008333452) * fVar98
                         + 0.041665796) * fVar98 + 0.16666666) * fVar98 + 0.5) * fVar98 * fVar98;
                  auVar72._12_4_ =
                       fVar99 + fVar69 +
                       (((((fVar99 * 0.00019875691 + 0.0013981999) * fVar99 + 0.008333452) * fVar99
                         + 0.041665796) * fVar99 + 0.16666666) * fVar99 + 0.5) * fVar99 * fVar99;
                  fVar90 = (float)((int)fVar90 * 0x800000 + (int)fVar67) * auVar72._0_4_ + fVar67;
                  fVar92 = (float)((int)fVar92 * 0x800000 + (int)auVar85._0_4_) * auVar72._4_4_ +
                           auVar85._0_4_;
                  fVar94 = (float)((int)fVar94 * 0x800000 + (int)fVar68) * auVar72._8_4_ + fVar68;
                  fVar95 = (float)((int)fVar95 * 0x800000 + (int)fVar69) * auVar72._12_4_ + fVar69;
                  auVar30._4_4_ = fVar92;
                  auVar30._0_4_ = fVar90;
                  auVar30._8_4_ = fVar94;
                  auVar30._12_4_ = fVar95;
                  auVar76 = rcpps(auVar72,auVar30);
                  fVar96 = auVar76._0_4_;
                  fVar97 = auVar76._4_4_;
                  fVar98 = auVar76._8_4_;
                  fVar99 = auVar76._12_4_;
                  auVar101._0_4_ =
                       fVar70 * (fVar96 + fVar96 + -1.0 +
                                (2.0 - fVar90 * (fVar96 + fVar96)) * fVar96);
                  auVar101._4_4_ =
                       fVar91 * (fVar97 + fVar97 + -1.0 +
                                (2.0 - fVar92 * (fVar97 + fVar97)) * fVar97);
                  auVar101._8_4_ =
                       fVar82 * (fVar98 + fVar98 + -1.0 +
                                (2.0 - fVar94 * (fVar98 + fVar98)) * fVar98);
                  auVar101._12_4_ =
                       fVar93 * (fVar99 + fVar99 + -1.0 +
                                (2.0 - fVar95 * (fVar99 + fVar99)) * fVar99);
                  break;
                case 6:
                  fVar96 = **(float **)(&this->field_0x118 + (long)p_Var47);
                  fVar97 = (*(float **)(&this->field_0x118 + (long)p_Var47))[1];
                  auVar75._0_4_ = fVar96 * fVar70 + fVar97;
                  auVar75._4_4_ = fVar96 * fVar91 + fVar97;
                  auVar75._8_4_ = fVar96 * fVar82 + fVar97;
                  auVar75._12_4_ = fVar96 * fVar93 + fVar97;
                  auVar76 = maxps(auVar75,auVar76);
                  auVar76 = minps(auVar76,auVar86);
                  auVar101._0_4_ = fVar70 * auVar76._0_4_;
                  auVar101._4_4_ = fVar91 * auVar76._4_4_;
                  auVar101._8_4_ = fVar82 * auVar76._8_4_;
                  auVar101._12_4_ = fVar93 * auVar76._12_4_;
                }
                *pauVar54 = auVar101;
                pauVar54 = pauVar54 + 1;
                uVar58 = uVar58 + 1;
                iVar45 = iVar45 + 1;
              } while (uVar58 != local_f8.w);
            }
            iVar41 = iVar41 + 1;
          } while (iVar41 != local_f8.h);
        }
        local_190 = local_190 + 1;
      } while (local_190 != local_f8.c);
    }
    auVar86 = _DAT_0054dea0;
    auVar32 = _DAT_0054de70;
    auVar84 = _DAT_0054de60;
    if ((((int)local_a8 == 1) && (local_194 == 4)) &&
       (local_58 = (ulong)local_f8.c, 0 < (long)local_58)) {
      p_Var47 = local_80[-3];
      iVar52 = *(int *)(&this->field_0xdc + (long)p_Var47);
      iVar9 = *(int *)(&this->field_0xe0 + (long)p_Var47);
      iVar51 = *(int *)(&this->field_0xe4 + (long)p_Var47);
      iVar46 = *(int *)(&this->field_0xe8 + (long)p_Var47);
      uVar12 = *(undefined4 *)(&this->field_0x114 + (long)p_Var47);
      lVar61 = *(long *)(&this->field_0x1a8 + (long)p_Var47);
      uVar11 = *(uint *)(&this->field_0xd4 + (long)p_Var47);
      uVar14 = *(uint *)(&this->field_0xd8 + (long)p_Var47);
      iVar42 = (1 - uVar11) * iVar52;
      local_50 = (_func_int *)CONCAT44(local_50._4_4_,iVar42);
      local_1b0 = 0;
      fVar67 = (float)DAT_0054dea0;
      auVar85._0_4_ = DAT_0054dea0._4_4_;
      fVar68 = DAT_0054dea0._8_4_;
      fVar69 = DAT_0054dea0._12_4_;
      do {
        if (0 < local_f8.h) {
          iVar13 = bottom_blob->w;
          iVar41 = bottom_blob->h;
          pauVar54 = (undefined1 (*) [16])
                     (local_f8.cstep * local_1b0 *
                      CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize) +
                     (long)local_f8.data);
          uVar58 = bottom_blob->c;
          iVar45 = 0;
          do {
            if (0 < local_f8.w) {
              uVar56 = 0;
              iVar39 = iVar42;
              do {
                auVar76 = ZEXT816(0);
                if (lVar61 == 0) {
                  auVar88 = ZEXT816(0);
                }
                else {
                  auVar88 = *(undefined1 (*) [16])(lVar61 + local_1b0 * 0x10);
                }
                if (0 < (int)uVar58) {
                  pvVar65 = (void *)((this->weight_data_tm).cstep * local_1b0 *
                                     (this->weight_data_tm).elemsize +
                                    (long)(this->weight_data_tm).data);
                  lVar48 = (long)bottom_blob->w * bottom_blob->elemsize;
                  local_98._0_8_ = lVar48;
                  uVar57 = 0;
                  do {
                    if (0 < (int)uVar14) {
                      uVar59 = 0;
                      uVar55 = 0;
                      do {
                        iVar40 = (((int)uVar55 - uVar14) + 1) * iVar9 + iVar45;
                        if ((((-1 < iVar40) && (iVar43 = iVar40 / iVar46, iVar40 % iVar46 == 0)) &&
                            (iVar43 < iVar41)) && (0 < (int)uVar11)) {
                          uVar63 = uVar59;
                          uVar64 = (ulong)uVar11;
                          auVar101 = auVar88;
                          iVar40 = iVar39;
                          do {
                            auVar88 = auVar101;
                            if (((-1 < iVar40) && (iVar44 = iVar40 / iVar51, iVar40 % iVar51 == 0))
                               && (iVar44 < iVar13)) {
                              fVar70 = *(float *)((long)bottom_blob->data +
                                                 (long)iVar44 * 4 +
                                                 iVar43 * lVar48 +
                                                 bottom_blob->cstep * bottom_blob->elemsize * uVar57
                                                 );
                              pfVar1 = (float *)((long)pvVar65 + (uVar63 & 0xffffffff) * 4);
                              auVar88._0_4_ = auVar101._0_4_ + fVar70 * *pfVar1;
                              auVar88._4_4_ = auVar101._4_4_ + fVar70 * pfVar1[1];
                              auVar88._8_4_ = auVar101._8_4_ + fVar70 * pfVar1[2];
                              auVar88._12_4_ = auVar101._12_4_ + fVar70 * pfVar1[3];
                            }
                            uVar63 = uVar63 + 4;
                            iVar40 = iVar40 + iVar52;
                            uVar64 = uVar64 - 1;
                            auVar101 = auVar88;
                          } while (uVar64 != 0);
                        }
                        uVar55 = uVar55 + 1;
                        uVar59 = uVar59 + (ulong)uVar11 * 4;
                      } while (uVar55 != uVar14);
                    }
                    pvVar65 = (void *)((long)pvVar65 + (long)(int)(uVar11 * uVar14 * 4) * 4);
                    uVar57 = uVar57 + 1;
                  } while (uVar57 != uVar58);
                }
                fVar70 = auVar88._0_4_;
                fVar91 = auVar88._4_4_;
                fVar82 = auVar88._8_4_;
                fVar93 = auVar88._12_4_;
                switch(uVar12) {
                case 1:
                  auVar88 = maxps(auVar88,auVar76);
                  break;
                case 2:
                  auVar101 = maxps(auVar88,auVar76);
                  auVar76 = minps(auVar88,auVar76);
                  fVar70 = **(float **)(&this->field_0x118 + (long)p_Var47);
                  auVar88._4_4_ = fVar70 * auVar76._4_4_ + auVar101._4_4_;
                  auVar88._0_4_ = fVar70 * auVar76._0_4_ + auVar101._0_4_;
                  auVar88._8_4_ = fVar70 * auVar76._8_4_ + auVar101._8_4_;
                  auVar88._12_4_ = fVar70 * auVar76._12_4_ + auVar101._12_4_;
                  break;
                case 3:
                  uVar5 = **(undefined4 **)(&this->field_0x118 + (long)p_Var47);
                  uVar6 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var47))[1];
                  auVar79._4_4_ = uVar5;
                  auVar79._0_4_ = uVar5;
                  auVar79._8_4_ = uVar5;
                  auVar79._12_4_ = uVar5;
                  auVar76 = maxps(auVar88,auVar79);
                  auVar29._4_4_ = uVar6;
                  auVar29._0_4_ = uVar6;
                  auVar29._8_4_ = uVar6;
                  auVar29._12_4_ = uVar6;
                  auVar88 = minps(auVar76,auVar29);
                  break;
                case 4:
                  auVar89._0_8_ = auVar88._0_8_ ^ 0x8000000080000000;
                  auVar89._8_4_ = -fVar82;
                  auVar89._12_4_ = -fVar93;
                  auVar76 = minps(auVar89,auVar84);
                  auVar76 = maxps(auVar76,auVar32);
                  fVar91 = auVar76._0_4_ * 1.442695 + 0.5;
                  fVar93 = auVar76._4_4_ * 1.442695 + 0.5;
                  fVar97 = auVar76._8_4_ * 1.442695 + 0.5;
                  fVar99 = auVar76._12_4_ * 1.442695 + 0.5;
                  fVar70 = (float)(int)fVar91;
                  fVar82 = (float)(int)fVar93;
                  fVar96 = (float)(int)fVar97;
                  fVar98 = (float)(int)fVar99;
                  fVar70 = fVar70 - (float)(-(uint)(fVar91 < fVar70) & (uint)fVar67);
                  fVar82 = fVar82 - (float)(-(uint)(fVar93 < fVar82) & (uint)auVar85._0_4_);
                  fVar96 = fVar96 - (float)(-(uint)(fVar97 < fVar96) & (uint)fVar68);
                  fVar98 = fVar98 - (float)(-(uint)(fVar99 < fVar98) & (uint)fVar69);
                  fVar91 = fVar70 * -0.6931472 + auVar76._0_4_;
                  fVar93 = fVar82 * -0.6931472 + auVar76._4_4_;
                  fVar97 = fVar96 * -0.6931472 + auVar76._8_4_;
                  fVar99 = fVar98 * -0.6931472 + auVar76._12_4_;
                  auVar80._0_4_ =
                       fVar91 + fVar67 +
                       (((((fVar91 * 0.00019875691 + 0.0013981999) * fVar91 + 0.008333452) * fVar91
                         + 0.041665796) * fVar91 + 0.16666666) * fVar91 + 0.5) * fVar91 * fVar91;
                  auVar80._4_4_ =
                       fVar93 + auVar85._0_4_ +
                       (((((fVar93 * 0.00019875691 + 0.0013981999) * fVar93 + 0.008333452) * fVar93
                         + 0.041665796) * fVar93 + 0.16666666) * fVar93 + 0.5) * fVar93 * fVar93;
                  auVar80._8_4_ =
                       fVar97 + fVar68 +
                       (((((fVar97 * 0.00019875691 + 0.0013981999) * fVar97 + 0.008333452) * fVar97
                         + 0.041665796) * fVar97 + 0.16666666) * fVar97 + 0.5) * fVar97 * fVar97;
                  auVar80._12_4_ =
                       fVar99 + fVar69 +
                       (((((fVar99 * 0.00019875691 + 0.0013981999) * fVar99 + 0.008333452) * fVar99
                         + 0.041665796) * fVar99 + 0.16666666) * fVar99 + 0.5) * fVar99 * fVar99;
                  fVar97 = (float)((int)fVar70 * 0x800000 + (int)fVar67) * auVar80._0_4_ + fVar67;
                  fVar99 = (float)((int)fVar82 * 0x800000 + (int)auVar85._0_4_) * auVar80._4_4_ +
                           auVar85._0_4_;
                  fVar96 = (float)((int)fVar96 * 0x800000 + (int)fVar68) * auVar80._8_4_ + fVar68;
                  fVar98 = (float)((int)fVar98 * 0x800000 + (int)fVar69) * auVar80._12_4_ + fVar69;
                  auVar28._4_4_ = fVar99;
                  auVar28._0_4_ = fVar97;
                  auVar28._8_4_ = fVar96;
                  auVar28._12_4_ = fVar98;
                  auVar76 = rcpps(auVar80,auVar28);
                  fVar70 = auVar76._0_4_;
                  fVar91 = auVar76._4_4_;
                  fVar82 = auVar76._8_4_;
                  fVar93 = auVar76._12_4_;
                  auVar88._0_4_ = (fVar67 - fVar97 * fVar70) * fVar70 + fVar70;
                  auVar88._4_4_ = (auVar85._0_4_ - fVar99 * fVar91) * fVar91 + fVar91;
                  auVar88._8_4_ = (fVar68 - fVar96 * fVar82) * fVar82 + fVar82;
                  auVar88._12_4_ = (fVar69 - fVar98 * fVar93) * fVar93 + fVar93;
                  break;
                case 5:
                  auVar76 = minps(auVar88,auVar84);
                  auVar76 = maxps(auVar76,auVar32);
                  fVar96 = auVar76._0_4_ * 1.442695 + 0.5;
                  fVar97 = auVar76._4_4_ * 1.442695 + 0.5;
                  fVar98 = auVar76._8_4_ * 1.442695 + 0.5;
                  fVar99 = auVar76._12_4_ * 1.442695 + 0.5;
                  fVar90 = (float)(int)fVar96;
                  fVar92 = (float)(int)fVar97;
                  fVar94 = (float)(int)fVar98;
                  fVar95 = (float)(int)fVar99;
                  fVar90 = fVar90 - (float)(-(uint)(fVar96 < fVar90) & (uint)fVar67);
                  fVar92 = fVar92 - (float)(-(uint)(fVar97 < fVar92) & (uint)auVar85._0_4_);
                  fVar94 = fVar94 - (float)(-(uint)(fVar98 < fVar94) & (uint)fVar68);
                  fVar95 = fVar95 - (float)(-(uint)(fVar99 < fVar95) & (uint)fVar69);
                  fVar96 = auVar76._0_4_ - fVar90 * 0.6931472;
                  fVar97 = auVar76._4_4_ - fVar92 * 0.6931472;
                  fVar98 = auVar76._8_4_ - fVar94 * 0.6931472;
                  fVar99 = auVar76._12_4_ - fVar95 * 0.6931472;
                  auVar102._0_4_ =
                       (float)((int)fVar90 * 0x800000 + (int)fVar67) *
                       (fVar96 + fVar67 +
                       (((((fVar96 * 0.00019875691 + 0.0013981999) * fVar96 + 0.008333452) * fVar96
                         + 0.041665796) * fVar96 + 0.16666666) * fVar96 + 0.5) * fVar96 * fVar96) +
                       fVar67;
                  auVar102._4_4_ =
                       (float)((int)fVar92 * 0x800000 + (int)auVar85._0_4_) *
                       (fVar97 + auVar85._0_4_ +
                       (((((fVar97 * 0.00019875691 + 0.0013981999) * fVar97 + 0.008333452) * fVar97
                         + 0.041665796) * fVar97 + 0.16666666) * fVar97 + 0.5) * fVar97 * fVar97) +
                       auVar85._0_4_;
                  auVar102._8_4_ =
                       (float)((int)fVar94 * 0x800000 + (int)fVar68) *
                       (fVar98 + fVar68 +
                       (((((fVar98 * 0.00019875691 + 0.0013981999) * fVar98 + 0.008333452) * fVar98
                         + 0.041665796) * fVar98 + 0.16666666) * fVar98 + 0.5) * fVar98 * fVar98) +
                       fVar68;
                  auVar102._12_4_ =
                       (float)((int)fVar95 * 0x800000 + (int)fVar69) *
                       (fVar99 + fVar69 +
                       (((((fVar99 * 0.00019875691 + 0.0013981999) * fVar99 + 0.008333452) * fVar99
                         + 0.041665796) * fVar99 + 0.16666666) * fVar99 + 0.5) * fVar99 * fVar99) +
                       fVar69;
                  auVar76 = maxps(auVar102,_DAT_0054df10);
                  fVar96 = (float)(auVar76._0_4_ & 0x807fffff | 0x3f000000);
                  fVar98 = (float)(auVar76._4_4_ & 0x807fffff | 0x3f000000);
                  fVar90 = (float)(auVar76._8_4_ & 0x807fffff | 0x3f000000);
                  fVar94 = (float)(auVar76._12_4_ & 0x807fffff | 0x3f000000);
                  fVar97 = fVar96 + -1.0 + (float)(-(uint)(fVar96 < 0.70710677) & (uint)fVar96);
                  fVar99 = fVar98 + -1.0 + (float)(-(uint)(fVar98 < 0.70710677) & (uint)fVar98);
                  fVar92 = fVar90 + -1.0 + (float)(-(uint)(fVar90 < 0.70710677) & (uint)fVar90);
                  fVar95 = fVar94 + -1.0 + (float)(-(uint)(fVar94 < 0.70710677) & (uint)fVar94);
                  auVar77._0_8_ =
                       CONCAT44(-(uint)(auVar102._4_4_ <= 0.0),-(uint)(auVar102._0_4_ <= 0.0)) &
                       0x7fffffff7fffffff;
                  auVar77._8_4_ = -(uint)(auVar102._8_4_ <= 0.0) & 0x7fffffff;
                  auVar77._12_4_ = -(uint)(auVar102._12_4_ <= 0.0) & 0x7fffffff;
                  auVar25._4_4_ =
                       ~-(uint)(auVar102._4_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar76._4_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar98 < 0.70710677) & (uint)auVar85._0_4_)) *
                               0.6931472 + fVar99 +
                              (((((((((fVar99 * 0.070376836 + -0.1151461) * fVar99 + 0.116769984) *
                                     fVar99 + -0.12420141) * fVar99 + 0.14249323) * fVar99 +
                                  -0.16668057) * fVar99 + 0.20000714) * fVar99 + -0.24999994) *
                                fVar99 + 0.3333333) * fVar99 + -0.5) * fVar99 * fVar99) * -2.0);
                  auVar25._0_4_ =
                       ~-(uint)(auVar102._0_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar76._0_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar96 < 0.70710677) & (uint)fVar67)) * 0.6931472 +
                               fVar97 + (((((((((fVar97 * 0.070376836 + -0.1151461) * fVar97 +
                                               0.116769984) * fVar97 + -0.12420141) * fVar97 +
                                             0.14249323) * fVar97 + -0.16668057) * fVar97 +
                                           0.20000714) * fVar97 + -0.24999994) * fVar97 + 0.3333333)
                                         * fVar97 + -0.5) * fVar97 * fVar97) * -2.0);
                  auVar25._8_4_ =
                       ~-(uint)(auVar102._8_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar76._8_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar90 < 0.70710677) & (uint)fVar68)) * 0.6931472 +
                               fVar92 + (((((((((fVar92 * 0.070376836 + -0.1151461) * fVar92 +
                                               0.116769984) * fVar92 + -0.12420141) * fVar92 +
                                             0.14249323) * fVar92 + -0.16668057) * fVar92 +
                                           0.20000714) * fVar92 + -0.24999994) * fVar92 + 0.3333333)
                                         * fVar92 + -0.5) * fVar92 * fVar92) * -2.0);
                  auVar25._12_4_ =
                       ~-(uint)(auVar102._12_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar76._12_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar94 < 0.70710677) & (uint)fVar69)) * 0.6931472 +
                               fVar95 + (((((((((fVar95 * 0.070376836 + -0.1151461) * fVar95 +
                                               0.116769984) * fVar95 + -0.12420141) * fVar95 +
                                             0.14249323) * fVar95 + -0.16668057) * fVar95 +
                                           0.20000714) * fVar95 + -0.24999994) * fVar95 + 0.3333333)
                                         * fVar95 + -0.5) * fVar95 * fVar95) * -2.0);
                  auVar76 = minps(auVar77 | auVar25,auVar84);
                  auVar76 = maxps(auVar76,auVar32);
                  fVar96 = auVar76._0_4_ * 1.442695 + 0.5;
                  fVar97 = auVar76._4_4_ * 1.442695 + 0.5;
                  fVar98 = auVar76._8_4_ * 1.442695 + 0.5;
                  fVar99 = auVar76._12_4_ * 1.442695 + 0.5;
                  fVar90 = (float)(int)fVar96;
                  fVar92 = (float)(int)fVar97;
                  fVar94 = (float)(int)fVar98;
                  fVar95 = (float)(int)fVar99;
                  fVar90 = fVar90 - (float)(-(uint)(fVar96 < fVar90) & (uint)fVar67);
                  fVar92 = fVar92 - (float)(-(uint)(fVar97 < fVar92) & (uint)auVar85._0_4_);
                  fVar94 = fVar94 - (float)(-(uint)(fVar98 < fVar94) & (uint)fVar68);
                  fVar95 = fVar95 - (float)(-(uint)(fVar99 < fVar95) & (uint)fVar69);
                  fVar96 = auVar76._0_4_ - fVar90 * 0.6931472;
                  fVar97 = auVar76._4_4_ - fVar92 * 0.6931472;
                  fVar98 = auVar76._8_4_ - fVar94 * 0.6931472;
                  fVar99 = auVar76._12_4_ - fVar95 * 0.6931472;
                  auVar78._0_4_ =
                       fVar96 + fVar67 +
                       (((((fVar96 * 0.00019875691 + 0.0013981999) * fVar96 + 0.008333452) * fVar96
                         + 0.041665796) * fVar96 + 0.16666666) * fVar96 + 0.5) * fVar96 * fVar96;
                  auVar78._4_4_ =
                       fVar97 + auVar85._0_4_ +
                       (((((fVar97 * 0.00019875691 + 0.0013981999) * fVar97 + 0.008333452) * fVar97
                         + 0.041665796) * fVar97 + 0.16666666) * fVar97 + 0.5) * fVar97 * fVar97;
                  auVar78._8_4_ =
                       fVar98 + fVar68 +
                       (((((fVar98 * 0.00019875691 + 0.0013981999) * fVar98 + 0.008333452) * fVar98
                         + 0.041665796) * fVar98 + 0.16666666) * fVar98 + 0.5) * fVar98 * fVar98;
                  auVar78._12_4_ =
                       fVar99 + fVar69 +
                       (((((fVar99 * 0.00019875691 + 0.0013981999) * fVar99 + 0.008333452) * fVar99
                         + 0.041665796) * fVar99 + 0.16666666) * fVar99 + 0.5) * fVar99 * fVar99;
                  fVar90 = (float)((int)fVar90 * 0x800000 + (int)fVar67) * auVar78._0_4_ + fVar67;
                  fVar92 = (float)((int)fVar92 * 0x800000 + (int)auVar85._0_4_) * auVar78._4_4_ +
                           auVar85._0_4_;
                  fVar94 = (float)((int)fVar94 * 0x800000 + (int)fVar68) * auVar78._8_4_ + fVar68;
                  fVar95 = (float)((int)fVar95 * 0x800000 + (int)fVar69) * auVar78._12_4_ + fVar69;
                  auVar31._4_4_ = fVar92;
                  auVar31._0_4_ = fVar90;
                  auVar31._8_4_ = fVar94;
                  auVar31._12_4_ = fVar95;
                  auVar76 = rcpps(auVar78,auVar31);
                  fVar96 = auVar76._0_4_;
                  fVar97 = auVar76._4_4_;
                  fVar98 = auVar76._8_4_;
                  fVar99 = auVar76._12_4_;
                  auVar88._0_4_ =
                       fVar70 * (fVar96 + fVar96 + -1.0 +
                                (2.0 - fVar90 * (fVar96 + fVar96)) * fVar96);
                  auVar88._4_4_ =
                       fVar91 * (fVar97 + fVar97 + -1.0 +
                                (2.0 - fVar92 * (fVar97 + fVar97)) * fVar97);
                  auVar88._8_4_ =
                       fVar82 * (fVar98 + fVar98 + -1.0 +
                                (2.0 - fVar94 * (fVar98 + fVar98)) * fVar98);
                  auVar88._12_4_ =
                       fVar93 * (fVar99 + fVar99 + -1.0 +
                                (2.0 - fVar95 * (fVar99 + fVar99)) * fVar99);
                  break;
                case 6:
                  fVar96 = **(float **)(&this->field_0x118 + (long)p_Var47);
                  fVar97 = (*(float **)(&this->field_0x118 + (long)p_Var47))[1];
                  auVar81._0_4_ = fVar96 * fVar70 + fVar97;
                  auVar81._4_4_ = fVar96 * fVar91 + fVar97;
                  auVar81._8_4_ = fVar96 * fVar82 + fVar97;
                  auVar81._12_4_ = fVar96 * fVar93 + fVar97;
                  auVar76 = maxps(auVar81,auVar76);
                  auVar76 = minps(auVar76,auVar86);
                  auVar88._0_4_ = fVar70 * auVar76._0_4_;
                  auVar88._4_4_ = fVar91 * auVar76._4_4_;
                  auVar88._8_4_ = fVar82 * auVar76._8_4_;
                  auVar88._12_4_ = fVar93 * auVar76._12_4_;
                }
                *pauVar54 = auVar88;
                pauVar54 = pauVar54 + 1;
                uVar56 = uVar56 + 1;
                iVar39 = iVar39 + 1;
              } while (uVar56 != local_f8.w);
            }
            iVar45 = iVar45 + 1;
          } while (iVar45 != local_f8.h);
        }
        local_1b0 = local_1b0 + 1;
      } while (local_1b0 != local_58);
    }
    if ((((int)local_a8 == 4) && (local_194 == 1)) && (local_38 = (long)local_f8.c, 0 < local_38)) {
      local_50 = local_80[-3];
      iVar52 = *(int *)(&this->field_0xdc + (long)local_50);
      iVar9 = *(int *)(&this->field_0xe0 + (long)local_50);
      iVar51 = *(int *)(&this->field_0xe4 + (long)local_50);
      iVar46 = *(int *)(&this->field_0xe8 + (long)local_50);
      uVar12 = *(undefined4 *)(&this->field_0x114 + (long)local_50);
      lVar61 = *(long *)(&this->field_0x1a8 + (long)local_50);
      uVar11 = *(uint *)(&this->field_0xd4 + (long)local_50);
      uVar14 = *(uint *)(&this->field_0xd8 + (long)local_50);
      local_80 = (_func_int **)local_f8.data;
      local_40 = CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize) * local_f8.cstep;
      iVar42 = bottom_blob->w;
      iVar13 = bottom_blob->h;
      local_58 = CONCAT44(local_58._4_4_,(1 - uVar11) * iVar52);
      uVar58 = bottom_blob->c;
      local_1b0 = 0;
      do {
        if (0 < iVar8) {
          sVar18 = (this->weight_data_tm).cstep;
          sVar19 = (this->weight_data_tm).elemsize;
          local_188 = (_func_int **)(local_40 * local_1b0 + (long)local_80);
          pvVar65 = (this->weight_data_tm).data;
          iVar41 = 0;
          do {
            if (0 < iVar7) {
              iVar45 = bottom_blob->w;
              pvVar17 = bottom_blob->data;
              sVar20 = bottom_blob->elemsize;
              sVar21 = bottom_blob->cstep;
              pfVar1 = *(float **)(&this->field_0x118 + (long)local_50);
              uVar56 = 0;
              local_150 = local_58 & 0xffffffff;
              do {
                if (lVar61 == 0) {
                  fVar67 = 0.0;
                }
                else {
                  fVar67 = *(float *)(lVar61 + local_1b0 * 4);
                }
                if ((int)uVar58 < 1) {
                  auVar85._0_4_ = 0.0;
                  fVar68 = 0.0;
                  fVar69 = 0.0;
                  fVar70 = 0.0;
                }
                else {
                  auVar85._0_4_ = 0.0;
                  fVar68 = 0.0;
                  fVar69 = 0.0;
                  fVar70 = 0.0;
                  uVar57 = 0;
                  pvVar60 = (void *)(sVar18 * local_1b0 * sVar19 + (long)pvVar65);
                  do {
                    local_98._0_8_ = uVar57;
                    if (0 < (int)uVar14) {
                      uVar59 = 0;
                      uVar55 = 0;
                      do {
                        iVar39 = (((int)uVar55 - uVar14) + 1) * iVar9 + iVar41;
                        if ((((-1 < iVar39) && (iVar40 = iVar39 / iVar46, iVar39 % iVar46 == 0)) &&
                            (0 < (int)uVar11)) && (iVar40 < iVar13)) {
                          uVar63 = (ulong)uVar11;
                          uVar64 = uVar59;
                          iVar39 = (int)local_150;
                          do {
                            if (((-1 < iVar39) && (iVar43 = iVar39 / iVar51, iVar39 % iVar51 == 0))
                               && (iVar43 < iVar42)) {
                              pfVar2 = (float *)((long)pvVar60 + (uVar64 & 0xffffffff) * 4);
                              pfVar3 = (float *)((long)pvVar17 +
                                                (long)(iVar43 << 2) * 4 +
                                                (long)iVar40 * (long)iVar45 * sVar20 +
                                                sVar21 * sVar20 * uVar57);
                              auVar85._0_4_ = auVar85._0_4_ + *pfVar2 * *pfVar3;
                              fVar68 = fVar68 + pfVar2[1] * pfVar3[1];
                              fVar69 = fVar69 + pfVar2[2] * pfVar3[2];
                              fVar70 = fVar70 + pfVar2[3] * pfVar3[3];
                            }
                            uVar64 = uVar64 + 4;
                            iVar39 = iVar39 + iVar52;
                            uVar63 = uVar63 - 1;
                          } while (uVar63 != 0);
                        }
                        uVar55 = uVar55 + 1;
                        uVar59 = uVar59 + (ulong)uVar11 * 4;
                      } while (uVar55 != uVar14);
                    }
                    pvVar60 = (void *)((long)pvVar60 + (long)(int)(uVar11 * uVar14 * 4) * 4);
                    uVar57 = uVar57 + 1;
                  } while (uVar57 != uVar58);
                }
                auVar84._4_4_ = fVar70 + fVar68;
                auVar84._0_4_ = auVar84._4_4_;
                auVar84._8_4_ = auVar84._4_4_;
                auVar84._12_4_ = auVar84._4_4_;
                auVar85._4_12_ = auVar84._4_12_;
                auVar85._0_4_ = auVar84._4_4_ + fVar67 + fVar69 + auVar85._0_4_;
                fVar67 = auVar85._0_4_;
                switch(uVar12) {
                case 1:
                  if (auVar85._0_4_ <= 0.0) {
                    auVar32._12_4_ = 0;
                    auVar32._0_12_ = auVar85._4_12_;
                    auVar85 = auVar32 << 0x20;
                  }
LAB_002aee0b:
                  fVar67 = auVar85._0_4_;
                  break;
                case 2:
                  fVar67 = (float)(~-(uint)(0.0 < auVar85._0_4_) & (uint)*pfVar1 |
                                  -(uint)(0.0 < auVar85._0_4_) & 0x3f800000) * auVar85._0_4_;
                  break;
                case 3:
                  if (auVar85._0_4_ <= *pfVar1) {
                    auVar85._0_4_ = *pfVar1;
                  }
                  fVar67 = auVar85._0_4_;
                  if (pfVar1[1] < auVar85._0_4_) {
                    fVar67 = pfVar1[1];
                  }
                  break;
                case 4:
                  if (88.37626 <= auVar85._0_4_) {
                    auVar85._0_4_ = 88.37626;
                  }
                  fVar67 = expf((float)(-(uint)(auVar85._0_4_ < -88.37626) & 0x42b0c0a5 |
                                       ~-(uint)(auVar85._0_4_ < -88.37626) & (uint)-auVar85._0_4_));
                  fVar67 = 1.0 / (fVar67 + 1.0);
                  break;
                case 5:
                  local_98 = auVar85;
                  fVar67 = expf(auVar85._0_4_);
                  fVar67 = logf(fVar67 + 1.0);
                  fVar67 = tanhf(fVar67);
                  fVar67 = fVar67 * (float)local_98._0_4_;
                  break;
                case 6:
                  fVar68 = *pfVar1;
                  fVar69 = -pfVar1[1] / fVar68;
                  fVar67 = 0.0;
                  if (fVar69 <= auVar85._0_4_) {
                    if (fVar69 + 1.0 / fVar68 < auVar85._0_4_) goto LAB_002aee0b;
                    fVar67 = (fVar68 * auVar85._0_4_ + pfVar1[1]) * auVar85._0_4_;
                  }
                }
                *(float *)local_188 = fVar67;
                local_188 = (_func_int **)((long)local_188 + 4);
                uVar56 = uVar56 + 1;
                local_150 = (ulong)((int)local_150 + 1);
              } while (uVar56 != iVar7);
            }
            iVar41 = iVar41 + 1;
          } while (iVar41 != iVar8);
        }
        local_1b0 = local_1b0 + 1;
      } while (local_1b0 != local_38);
    }
    iVar8 = local_f8.h;
    iVar7 = local_f8.w;
    pvVar65 = local_f8.data;
    if ((((int)local_a8 == 1) && (local_194 == 1)) &&
       (pp_Var22 = this->_vptr_Deconvolution_x86,
       0 < *(int *)(&this->field_0xd0 + (long)pp_Var22[-3]))) {
      iVar51 = local_78._0_4_;
      lVar61 = local_f8.cstep * CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize);
      iVar52 = bottom_blob->w;
      iVar9 = bottom_blob->h;
      uVar11 = bottom_blob->c;
      uVar57 = (ulong)(uint)local_f8.w;
      lVar48 = (long)local_f8.w;
      local_9c = -local_9c;
      local_188 = (_func_int **)0x0;
      do {
        if (0 < iVar8) {
          local_160 = (_func_int **)(lVar61 * (long)local_188 + (long)pvVar65);
          pp_Var23 = this->_vptr_Deconvolution_x86;
          sVar18 = (this->weight_data_tm).cstep;
          sVar19 = (this->weight_data_tm).elemsize;
          pvVar17 = (this->weight_data_tm).data;
          iVar46 = 0;
          do {
            if (0 < iVar7) {
              iVar13 = bottom_blob->w;
              pvVar60 = bottom_blob->data;
              sVar20 = bottom_blob->elemsize;
              local_98._0_8_ = bottom_blob->cstep * sVar20;
              pp_Var24 = this->_vptr_Deconvolution_x86;
              uVar55 = 0;
              iVar42 = local_9c;
              do {
                p_Var47 = pp_Var23[-3];
                if (*(int *)(&this->field_0x10c + (long)p_Var47) == 0) {
                  auVar83 = ZEXT812(0);
                }
                else {
                  auVar83._4_8_ = 0;
                  auVar83._0_4_ =
                       *(uint *)(*(long *)(&this->field_0x1a8 + (long)p_Var47) + (long)local_188 * 4
                                );
                }
                auVar86._12_4_ = 0;
                auVar86._0_12_ = auVar83;
                if (0 < (int)uVar11) {
                  p_Var47 = pp_Var24[-3];
                  local_78._0_8_ = (void *)(sVar18 * sVar19 * (long)local_188 + (long)pvVar17);
                  uVar59 = 0;
                  do {
                    if (0 < *(int *)(&this->field_0xd8 + (long)p_Var47)) {
                      iVar41 = 0;
                      do {
                        iVar45 = *(int *)(&this->field_0xe0 + (long)p_Var47) * iVar41 +
                                 (iVar46 - iVar50);
                        if (((-1 < iVar45) &&
                            (iVar39 = iVar45 / *(int *)(&this->field_0xe8 + (long)p_Var47),
                            iVar45 % *(int *)(&this->field_0xe8 + (long)p_Var47) == 0)) &&
                           (iVar39 < iVar9)) {
                          iVar45 = *(int *)(&this->field_0xd4 + (long)p_Var47);
                          if (0 < (long)iVar45) {
                            lVar62 = 0;
                            iVar40 = iVar42;
                            do {
                              if (((-1 < iVar40) &&
                                  (iVar43 = iVar40 / *(int *)(&this->field_0xe4 + (long)p_Var47),
                                  iVar40 % *(int *)(&this->field_0xe4 + (long)p_Var47) == 0)) &&
                                 (iVar43 < iVar52)) {
                                auVar86._0_4_ =
                                     auVar86._0_4_ +
                                     *(float *)(local_78._0_8_ + (ulong)(uint)(iVar45 * iVar41) * 4
                                               + lVar62 * 4) *
                                     *(float *)((long)pvVar60 +
                                               (long)iVar43 * 4 +
                                               (long)iVar39 * (long)iVar13 * sVar20 +
                                               local_98._0_8_ * uVar59);
                              }
                              lVar62 = lVar62 + 1;
                              iVar40 = iVar40 + *(int *)(&this->field_0xdc + (long)p_Var47);
                            } while (iVar45 != lVar62);
                          }
                        }
                        iVar41 = iVar41 + 1;
                      } while (iVar41 != *(int *)(&this->field_0xd8 + (long)p_Var47));
                    }
                    uVar59 = uVar59 + 1;
                    local_78._0_8_ = local_78._0_8_ + (long)(int)(iVar51 * uVar10) * 4;
                  } while (uVar59 != uVar11);
                }
                fVar67 = auVar86._0_4_;
                p_Var47 = pp_Var23[-3];
                auVar66 = auVar86;
                switch(*(undefined4 *)(&this->field_0x114 + (long)p_Var47)) {
                case 1:
                  if (fVar67 <= 0.0) {
                    auVar33._12_4_ = 0;
                    auVar33._0_12_ = auVar86._4_12_;
                    auVar66 = auVar33 << 0x20;
                  }
                  break;
                case 2:
                  auVar66 = ZEXT416((uint)((float)(-(uint)(0.0 < fVar67) & 0x3f800000 |
                                                  ~-(uint)(0.0 < fVar67) &
                                                  **(uint **)(&this->field_0x118 + (long)p_Var47)) *
                                          fVar67));
                  break;
                case 3:
                  auVar85._0_4_ = **(float **)(&this->field_0x118 + (long)p_Var47);
                  if (fVar67 <= auVar85._0_4_) {
                    auVar86._0_4_ = auVar85._0_4_;
                  }
                  fVar67 = (*(float **)(&this->field_0x118 + (long)p_Var47))[1];
                  auVar66 = auVar86;
                  if (fVar67 < auVar86._0_4_) {
LAB_002af413:
                    auVar66 = ZEXT416((uint)fVar67);
                  }
                  break;
                case 4:
                  if (88.37626 <= fVar67) {
                    fVar67 = 88.37626;
                  }
                  fVar67 = expf((float)(-(uint)(fVar67 < -88.37626) & 0x42b0c0a5 |
                                       ~-(uint)(fVar67 < -88.37626) & (uint)-fVar67));
                  auVar66 = ZEXT416((uint)(1.0 / (fVar67 + 1.0)));
                  break;
                case 5:
                  local_78 = auVar86;
                  fVar67 = expf(fVar67);
                  fVar67 = logf(fVar67 + 1.0);
                  fVar67 = tanhf(fVar67);
                  auVar66._0_4_ = fVar67 * (float)local_78._0_4_;
                  auVar66._4_12_ = extraout_var;
                  break;
                case 6:
                  auVar85._0_4_ = **(float **)(&this->field_0x118 + (long)p_Var47);
                  fVar68 = (*(float **)(&this->field_0x118 + (long)p_Var47))[1];
                  fVar69 = -fVar68 / auVar85._0_4_;
                  auVar66 = ZEXT816(0);
                  if ((fVar69 <= fVar67) &&
                     (auVar66 = auVar86, fVar67 <= fVar69 + 1.0 / auVar85._0_4_)) {
                    fVar67 = (auVar85._0_4_ * fVar67 + fVar68) * fVar67;
                    goto LAB_002af413;
                  }
                }
                *(int *)((long)local_160 + uVar55 * 4) = auVar66._0_4_;
                uVar55 = uVar55 + 1;
                iVar42 = iVar42 + 1;
              } while (uVar55 != uVar57);
            }
            local_160 = (_func_int **)((long)local_160 + lVar48 * 4);
            iVar46 = iVar46 + 1;
          } while (iVar46 != iVar8);
        }
        local_188 = (_func_int **)((long)local_188 + 1);
      } while ((long)local_188 < (long)*(int *)(&this->field_0xd0 + (long)pp_Var22[-3]));
    }
    pMVar38 = local_60;
    Deconvolution::cut_padding
              ((Deconvolution *)
               ((long)&this->_vptr_Deconvolution_x86 + (long)this->_vptr_Deconvolution_x86[-3]),
               &local_f8,local_60,local_48);
    iVar52 = -100;
    if ((pMVar38->data != (void *)0x0) && (iVar52 = -100, (long)pMVar38->c * pMVar38->cstep != 0)) {
      iVar52 = 0;
    }
  }
  piVar16 = (int *)CONCAT44(local_f8.refcount._4_4_,local_f8.refcount._0_4_);
  if (piVar16 != (int *)0x0) {
    LOCK();
    *piVar16 = *piVar16 + -1;
    UNLOCK();
    if (*piVar16 == 0) {
      if (local_f8.allocator == (Allocator *)0x0) {
        if ((_func_int **)local_f8.data != (_func_int **)0x0) {
          free(local_f8.data);
        }
      }
      else {
        (*(local_f8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar52;
}

Assistant:

int Deconvolution_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // deconvolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    //     NCNN_LOGE("Deconvolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16 && out_elempack == 16)
    {
        {
            deconvolution_pack16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 8 && out_elempack == 16)
    {
        {
            deconvolution_pack8to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 16 && out_elempack == 8)
    {
        {
            deconvolution_pack16to8_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 4 && out_elempack == 16)
    {
        {
            deconvolution_pack4to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 16 && out_elempack == 4)
    {
        {
            deconvolution_pack16to4_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 1 && out_elempack == 16)
    {
        {
            deconvolution_pack1to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 16 && out_elempack == 1)
    {
        {
            deconvolution_pack16to1_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }
#endif // __AVX512F__

    if (elempack == 8 && out_elempack == 8)
    {
        {
            deconvolution_pack8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 4 && out_elempack == 8)
    {
        {
            deconvolution_pack4to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 8 && out_elempack == 4)
    {
        {
            deconvolution_pack8to4_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 1 && out_elempack == 8)
    {
        {
            deconvolution_pack1to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 8 && out_elempack == 1)
    {
        {
            deconvolution_pack8to1_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }
#endif // __AVX__

    if (elempack == 4 && out_elempack == 4)
    {
        {
            deconvolution_pack4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 1 && out_elempack == 4)
    {
        {
            deconvolution_pack1to4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 4 && out_elempack == 1)
    {
        {
            deconvolution_pack4to1_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack == 1)
    {
        {
            // num_output
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < num_output; p++)
            {
                float* outptr = top_blob_bordered.channel(p);

                // shadowed variable for less openmp task args
                const int w = bottom_blob.w;
                const int h = bottom_blob.h;
                const int channels = bottom_blob.c;
                const int outw = top_blob_bordered.w;
                const int outh = top_blob_bordered.h;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                        {
                            sum = bias_data[p];
                        }

                        const float* kptr = (const float*)weight_data_tm.channel(p);

                        // channels
                        for (int q = 0; q < channels; q++)
                        {
                            const Mat m = bottom_blob.channel(q);

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                const float* sptr = m.row(sy);

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    float val = sptr[sx];

                                    int k = y * kernel_w + x;

                                    float w = kptr[k];

                                    sum += val * w;
                                }
                            }

                            kptr += maxk;
                        }

                        sum = activation_ss(sum, activation_type, activation_params);

                        outptr[j] = sum;
                    }

                    outptr += outw;
                }
            }
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}